

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

long __thiscall mkvparser::VideoTrack::Seek(VideoTrack *this,longlong time_ns,BlockEntry **pResult)

{
  Cluster **ppCVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  int iVar4;
  Cluster *pCVar5;
  long lVar6;
  undefined4 extraout_var;
  longlong lVar7;
  unsigned_long uVar8;
  Cluster **ppCVar9;
  Cluster **ppCVar10;
  BlockEntry *pBVar11;
  longlong t;
  Cluster **mid;
  Cluster **hi;
  Cluster **lo;
  Cluster **j;
  Cluster **i;
  long count;
  Cluster **clusters;
  Cluster *pCluster;
  long status;
  BlockEntry **pResult_local;
  longlong time_ns_local;
  VideoTrack *this_local;
  
  this_local = (VideoTrack *)Track::GetFirst(&this->super_Track,pResult);
  if (-1 < (long)this_local) {
    if (*pResult == (BlockEntry *)0x0) {
      __assert_fail("pResult",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x154a,
                    "virtual long mkvparser::VideoTrack::Seek(long long, const BlockEntry *&) const"
                   );
    }
    bVar3 = BlockEntry::EOS(*pResult);
    if (bVar3) {
      this_local = (VideoTrack *)0x0;
    }
    else {
      pCVar5 = BlockEntry::GetCluster(*pResult);
      if (pCVar5 == (Cluster *)0x0) {
        __assert_fail("pCluster",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x1550,
                      "virtual long mkvparser::VideoTrack::Seek(long long, const BlockEntry *&) const"
                     );
      }
      lVar6 = Cluster::GetIndex(pCVar5);
      if (lVar6 < 0) {
        __assert_fail("pCluster->GetIndex() >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x1551,
                      "virtual long mkvparser::VideoTrack::Seek(long long, const BlockEntry *&) const"
                     );
      }
      iVar4 = (*(*pResult)->_vptr_BlockEntry[2])();
      lVar7 = Block::GetTime((Block *)CONCAT44(extraout_var,iVar4),pCVar5);
      if (lVar7 < time_ns) {
        ppCVar1 = ((this->super_Track).m_pSegment)->m_clusters;
        if (ppCVar1 == (Cluster **)0x0) {
          __assert_fail("clusters",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                        ,0x1557,
                        "virtual long mkvparser::VideoTrack::Seek(long long, const BlockEntry *&) const"
                       );
        }
        uVar8 = Segment::GetCount((this->super_Track).m_pSegment);
        if ((long)uVar8 < 1) {
          __assert_fail("count > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                        ,0x155a,
                        "virtual long mkvparser::VideoTrack::Seek(long long, const BlockEntry *&) const"
                       );
        }
        lVar6 = Cluster::GetIndex(pCVar5);
        ppCVar9 = ppCVar1 + lVar6;
        if (ppCVar9 == (Cluster **)0x0) {
          __assert_fail("i",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                        ,0x155d,
                        "virtual long mkvparser::VideoTrack::Seek(long long, const BlockEntry *&) const"
                       );
        }
        if (*ppCVar9 != pCVar5) {
          __assert_fail("*i == pCluster",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                        ,0x155e,
                        "virtual long mkvparser::VideoTrack::Seek(long long, const BlockEntry *&) const"
                       );
        }
        lVar7 = Cluster::GetTime(pCVar5);
        if (time_ns < lVar7) {
          __assert_fail("pCluster->GetTime() <= time_ns",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                        ,0x155f,
                        "virtual long mkvparser::VideoTrack::Seek(long long, const BlockEntry *&) const"
                       );
        }
        mid = ppCVar1 + uVar8;
        hi = ppCVar9;
        while (hi < mid) {
          auVar2._8_8_ = (long)mid - (long)hi >> 0x3f;
          auVar2._0_8_ = (long)mid - (long)hi >> 3;
          ppCVar10 = hi + SUB168(auVar2 / SEXT816(2),0);
          if (mid <= ppCVar10) {
            __assert_fail("mid < hi",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                          ,0x156d,
                          "virtual long mkvparser::VideoTrack::Seek(long long, const BlockEntry *&) const"
                         );
          }
          pCVar5 = *ppCVar10;
          if (pCVar5 == (Cluster *)0x0) {
            __assert_fail("pCluster",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                          ,0x1570,
                          "virtual long mkvparser::VideoTrack::Seek(long long, const BlockEntry *&) const"
                         );
          }
          lVar6 = Cluster::GetIndex(pCVar5);
          if (lVar6 < 0) {
            __assert_fail("pCluster->GetIndex() >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                          ,0x1571,
                          "virtual long mkvparser::VideoTrack::Seek(long long, const BlockEntry *&) const"
                         );
          }
          lVar6 = Cluster::GetIndex(pCVar5);
          if (lVar6 != (long)ppCVar10 - (long)((this->super_Track).m_pSegment)->m_clusters >> 3) {
            __assert_fail("pCluster->GetIndex() == long(mid - m_pSegment->m_clusters)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                          ,0x1572,
                          "virtual long mkvparser::VideoTrack::Seek(long long, const BlockEntry *&) const"
                         );
          }
          lVar7 = Cluster::GetTime(pCVar5);
          if (lVar7 <= time_ns) {
            hi = ppCVar10 + 1;
            ppCVar10 = mid;
          }
          mid = ppCVar10;
          if (mid < hi) {
            __assert_fail("lo <= hi",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                          ,0x157b,
                          "virtual long mkvparser::VideoTrack::Seek(long long, const BlockEntry *&) const"
                         );
          }
        }
        if (hi != mid) {
          __assert_fail("lo == hi",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                        ,0x157e,
                        "virtual long mkvparser::VideoTrack::Seek(long long, const BlockEntry *&) const"
                       );
        }
        if (hi <= ppCVar9) {
          __assert_fail("lo > i",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                        ,0x157f,
                        "virtual long mkvparser::VideoTrack::Seek(long long, const BlockEntry *&) const"
                       );
        }
        if (ppCVar1 + uVar8 < hi) {
          __assert_fail("lo <= j",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                        ,0x1580,
                        "virtual long mkvparser::VideoTrack::Seek(long long, const BlockEntry *&) const"
                       );
        }
        pCVar5 = hi[-1];
        if (pCVar5 == (Cluster *)0x0) {
          __assert_fail("pCluster",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                        ,0x1583,
                        "virtual long mkvparser::VideoTrack::Seek(long long, const BlockEntry *&) const"
                       );
        }
        lVar7 = Cluster::GetTime(pCVar5);
        if (time_ns < lVar7) {
          __assert_fail("pCluster->GetTime() <= time_ns",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                        ,0x1584,
                        "virtual long mkvparser::VideoTrack::Seek(long long, const BlockEntry *&) const"
                       );
        }
        pBVar11 = Cluster::GetEntry(pCVar5,&this->super_Track,time_ns);
        *pResult = pBVar11;
        ppCVar1 = hi;
        if ((*pResult == (BlockEntry *)0x0) || (bVar3 = BlockEntry::EOS(*pResult), bVar3)) {
          do {
            hi = ppCVar1 + -1;
            if (hi == ppCVar9) {
              pBVar11 = Track::GetEOS(&this->super_Track);
              *pResult = pBVar11;
              return 0;
            }
            pCVar5 = ppCVar1[-2];
            if (pCVar5 == (Cluster *)0x0) {
              __assert_fail("pCluster",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                            ,0x158d,
                            "virtual long mkvparser::VideoTrack::Seek(long long, const BlockEntry *&) const"
                           );
            }
            lVar7 = Cluster::GetTime(pCVar5);
            if (time_ns < lVar7) {
              __assert_fail("pCluster->GetTime() <= time_ns",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                            ,0x158e,
                            "virtual long mkvparser::VideoTrack::Seek(long long, const BlockEntry *&) const"
                           );
            }
            pBVar11 = Cluster::GetEntry(pCVar5,&this->super_Track,time_ns);
            *pResult = pBVar11;
            ppCVar1 = hi;
          } while ((*pResult == (BlockEntry *)0x0) || (bVar3 = BlockEntry::EOS(*pResult), bVar3));
          this_local = (VideoTrack *)0x0;
        }
        else {
          this_local = (VideoTrack *)0x0;
        }
      }
      else {
        this_local = (VideoTrack *)0x0;
      }
    }
  }
  return (long)this_local;
}

Assistant:

long VideoTrack::Seek(long long time_ns, const BlockEntry*& pResult) const {
  const long status = GetFirst(pResult);

  if (status < 0)  // buffer underflow, etc
    return status;

  assert(pResult);

  if (pResult->EOS())
    return 0;

  const Cluster* pCluster = pResult->GetCluster();
  assert(pCluster);
  assert(pCluster->GetIndex() >= 0);

  if (time_ns <= pResult->GetBlock()->GetTime(pCluster))
    return 0;

  Cluster** const clusters = m_pSegment->m_clusters;
  assert(clusters);

  const long count = m_pSegment->GetCount();  // loaded only, not pre-loaded
  assert(count > 0);

  Cluster** const i = clusters + pCluster->GetIndex();
  assert(i);
  assert(*i == pCluster);
  assert(pCluster->GetTime() <= time_ns);

  Cluster** const j = clusters + count;

  Cluster** lo = i;
  Cluster** hi = j;

  while (lo < hi) {
    // INVARIANT:
    //[i, lo) <= time_ns
    //[lo, hi) ?
    //[hi, j)  > time_ns

    Cluster** const mid = lo + (hi - lo) / 2;
    assert(mid < hi);

    pCluster = *mid;
    assert(pCluster);
    assert(pCluster->GetIndex() >= 0);
    assert(pCluster->GetIndex() == long(mid - m_pSegment->m_clusters));

    const long long t = pCluster->GetTime();

    if (t <= time_ns)
      lo = mid + 1;
    else
      hi = mid;

    assert(lo <= hi);
  }

  assert(lo == hi);
  assert(lo > i);
  assert(lo <= j);

  pCluster = *--lo;
  assert(pCluster);
  assert(pCluster->GetTime() <= time_ns);

  pResult = pCluster->GetEntry(this, time_ns);

  if ((pResult != 0) && !pResult->EOS())  // found a keyframe
    return 0;

  while (lo != i) {
    pCluster = *--lo;
    assert(pCluster);
    assert(pCluster->GetTime() <= time_ns);

    pResult = pCluster->GetEntry(this, time_ns);

    if ((pResult != 0) && !pResult->EOS())
      return 0;
  }

  // weird: we're on the first cluster, but no keyframe found
  // should never happen but we must return something anyway

  pResult = GetEOS();
  return 0;
}